

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

attr * __thiscall Env::findvar(Env *this,string *s)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDI;
  Env *e;
  iterator found;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Base_ptr local_30;
  long local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>
  local_20 [4];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>
  ::_Rb_tree_iterator(local_20);
  local_28 = in_RDI;
  while( true ) {
    if (local_28 == 0) {
      return (attr *)0x0;
    }
    local_30 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
               ::find(in_stack_ffffffffffffffb8,(key_type *)0x10cb53);
    local_20[0]._M_node = local_30;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_20,&local_38);
    if (bVar1) break;
    local_28 = *(long *)(local_28 + 0x60);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>
                         *)0x10cb90);
  return &ppVar2->second;
}

Assistant:

struct attr *Env::findvar(const string &s) {
    map<string, attr>::iterator found;
    for (Env *e = this; e != NULL; e = e->pre) {
        found = e->var_table.find(s);
        if (found != e->var_table.end())
            return &(found->second);
    }
    return NULL;
}